

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O0

int garray_getfloatwords(_garray *x,int *size,t_word **vec)

{
  int iVar1;
  _array *p_Var2;
  t_word *ptVar3;
  _array *a;
  int elemsize;
  int yonset;
  t_word **vec_local;
  int *size_local;
  _garray *x_local;
  
  _elemsize = vec;
  vec_local = (t_word **)size;
  size_local = (int *)x;
  p_Var2 = garray_getarray_floatonly(x,(int *)((long)&a + 4),(int *)&a);
  if (p_Var2 == (_array *)0x0) {
    pd_error((void *)0x0,"%s: needs floating-point \'y\' field",**(undefined8 **)(size_local + 10));
    x_local._4_4_ = 0;
  }
  else if ((int)a == 8) {
    iVar1 = garray_npoints((_garray *)size_local);
    *(int *)vec_local = iVar1;
    ptVar3 = (t_word *)garray_vec((_garray *)size_local);
    *_elemsize = ptVar3;
    x_local._4_4_ = 1;
  }
  else {
    pd_error((void *)0x0,"%s: has more than one field",**(undefined8 **)(size_local + 10));
    x_local._4_4_ = 0;
  }
  return x_local._4_4_;
}

Assistant:

int garray_getfloatwords(t_garray *x, int *size, t_word **vec)
{
    int yonset, elemsize;
    t_array *a = garray_getarray_floatonly(x, &yonset, &elemsize);
    if (!a)
    {
        pd_error(0, "%s: needs floating-point 'y' field", x->x_realname->s_name);
        return (0);
    }
    else if (elemsize != sizeof(t_word))
    {
        pd_error(0, "%s: has more than one field", x->x_realname->s_name);
        return (0);
    }
    *size = garray_npoints(x);
    *vec =  (t_word *)garray_vec(x);
    return (1);
}